

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::initializeFromBuffer
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,void *buffer,int size,int capacity)

{
  int in_ECX;
  int in_EDX;
  btBvhSubtreeInfo *in_RSI;
  btAlignedObjectArray<btBvhSubtreeInfo> *in_RDI;
  
  clear(in_RDI);
  in_RDI->m_ownsMemory = false;
  in_RDI->m_data = in_RSI;
  in_RDI->m_size = in_EDX;
  in_RDI->m_capacity = in_ECX;
  return;
}

Assistant:

void initializeFromBuffer(void *buffer, int size, int capacity)
	{
		clear();
		m_ownsMemory = false;
		m_data = (T*)buffer;
		m_size = size;
		m_capacity = capacity;
	}